

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.h
# Opt level: O0

int LZ4HC_compress_optimal
              (LZ4HC_CCtx_internal *ctx,char *source,char *dest,int inputSize,int maxOutputSize,
              limitedOutput_directive limit,size_t sufficient_len,int fullUpdate)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  LZ4HC_CCtx_internal *pLVar4;
  U32 UVar5;
  uint uVar6;
  char *pcVar7;
  uint8_t *puVar8;
  ulong uVar9;
  ulong uVar10;
  uint8_t *puVar11;
  ulong uVar12;
  BYTE *pBVar13;
  BYTE *pBVar14;
  bool bVar15;
  ulong uStack_18670;
  size_t sStack_18668;
  uint32_t uStack_18650;
  uint32_t uStack_1863c;
  size_t sStack_18618;
  uint32_t uStack_18600;
  uint32_t uStack_185ec;
  int iStack_185e8;
  int lastRun;
  int offset_1;
  int ml_2;
  int offset;
  size_t ml_1;
  size_t price_8;
  size_t ll;
  size_t ml;
  size_t matchNb_1;
  size_t litlen;
  size_t price_3;
  BYTE *curPtr;
  size_t cost;
  size_t mlen;
  size_t matchNb;
  size_t best_off;
  size_t best_mlen;
  size_t cur;
  size_t match_num;
  size_t last_pos;
  size_t llen;
  BYTE *oend;
  BYTE *op;
  BYTE *matchlimit;
  BYTE *mflimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  LZ4HC_match_t matches [4097];
  int aiStack_10508 [2];
  LZ4HC_optimal_t opt [4097];
  limitedOutput_directive limit_local;
  int maxOutputSize_local;
  int inputSize_local;
  char *dest_local;
  char *source_local;
  LZ4HC_CCtx_internal *ctx_local;
  ulong local_4c0;
  size_t len;
  BYTE *token;
  size_t length;
  int local_468;
  int local_464;
  int mnum_3;
  U32 *local_458;
  uint8_t *local_450;
  uint8_t *local_448;
  LZ4HC_CCtx_internal *local_440;
  int local_434;
  uint local_430;
  uint local_42c;
  U32 idx_1;
  U32 target_1;
  BYTE *base_3;
  uint8_t *local_418;
  LZ4HC_CCtx_internal *local_410;
  int local_408;
  int local_404;
  int mnum;
  U32 *local_3f8;
  uint8_t *local_3f0;
  BYTE *local_3e8;
  LZ4HC_CCtx_internal *local_3e0;
  int local_3d4;
  uint local_3d0;
  uint local_3cc;
  U32 idx;
  U32 target;
  BYTE *base;
  BYTE *local_3b8;
  LZ4HC_CCtx_internal *local_3b0;
  long local_3a8;
  size_t price_14;
  undefined8 local_398;
  long local_390;
  size_t price_11;
  ulong local_380;
  long local_378;
  size_t price_9;
  ulong local_368;
  long local_360;
  size_t price;
  ulong local_350;
  ulong local_348;
  size_t price_1;
  ulong local_338;
  size_t price_10;
  ulong local_328;
  size_t price_12;
  undefined8 local_318;
  size_t price_15;
  ulong local_308;
  size_t price_13;
  undefined8 local_2f8;
  size_t price_7;
  ulong local_2e8;
  size_t price_6;
  ulong local_2d8;
  size_t price_5;
  ulong local_2c8;
  size_t price_4;
  ulong local_2b8;
  size_t price_2;
  BYTE *local_2a8;
  BYTE *vLimit;
  U32 *HashPos;
  size_t matchLength;
  U32 matchIndex;
  U16 delta1;
  U16 delta0;
  U16 *ptr1;
  U16 *ptr0;
  int mnum_1;
  int nbAttempts;
  BYTE *match;
  BYTE *dictBase;
  uint local_258;
  U32 lowLimit;
  U32 current;
  U32 dictLimit;
  BYTE *base_1;
  U32 *HashTable;
  U16 *chainTable;
  long local_230;
  U32 *local_228;
  uint8_t *local_220;
  uint8_t *local_218;
  LZ4HC_CCtx_internal *local_210;
  undefined4 local_204;
  BYTE *local_200;
  BYTE *vLimit_1;
  U32 *HashPos_1;
  size_t matchLength_1;
  U32 matchIndex_1;
  U16 delta1_1;
  U16 delta0_1;
  U16 *ptr1_1;
  U16 *ptr0_1;
  int mnum_2;
  int nbAttempts_1;
  BYTE *match_1;
  BYTE *dictBase_1;
  uint local_1b0;
  U32 lowLimit_1;
  U32 current_1;
  U32 dictLimit_1;
  BYTE *base_2;
  U32 *HashTable_1;
  U16 *chainTable_1;
  BYTE **local_188;
  U32 *local_180;
  uint8_t *local_178;
  BYTE *local_170;
  LZ4HC_CCtx_internal *local_168;
  undefined4 local_15c;
  BYTE *local_158;
  BYTE *vLimit_2;
  U32 *HashPos_2;
  size_t matchLength_2;
  U32 matchIndex_2;
  U16 delta1_2;
  U16 delta0_2;
  U16 *ptr1_2;
  U16 *ptr0_2;
  int mnum_4;
  int nbAttempts_2;
  BYTE *match_2;
  BYTE *dictBase_2;
  uint local_108;
  U32 lowLimit_2;
  U32 current_2;
  U32 dictLimit_2;
  BYTE *base_4;
  U32 *HashTable_2;
  U16 *chainTable_2;
  long local_e0;
  U32 *local_d8;
  uint8_t *local_d0;
  uint8_t *local_c8;
  LZ4HC_CCtx_internal *local_c0;
  undefined4 local_b4;
  BYTE *local_b0;
  BYTE *vLimit_3;
  U32 *HashPos_3;
  size_t matchLength_3;
  U32 matchIndex_3;
  U16 delta1_3;
  U16 delta0_3;
  U16 *ptr1_3;
  U16 *ptr0_3;
  int mnum_5;
  int nbAttempts_3;
  BYTE *match_3;
  BYTE *dictBase_3;
  uint local_60;
  U32 lowLimit_3;
  U32 current_3;
  U32 dictLimit_3;
  BYTE *base_5;
  U32 *HashTable_3;
  U16 *chainTable_3;
  BYTE **local_38;
  U32 *local_30;
  uint8_t *local_28;
  uint8_t *local_20;
  LZ4HC_CCtx_internal *local_18;
  undefined4 local_c;
  
  pcVar7 = source + inputSize;
  puVar8 = (uint8_t *)(pcVar7 + -5);
  if (0xfff < sufficient_len) {
    sufficient_len = 0xfff;
  }
  ctx->end = ctx->end + inputSize;
  anchor = (BYTE *)(source + 1);
  oend = (BYTE *)dest;
  iend = (BYTE *)source;
LAB_0016b52e:
  do {
    if (pcVar7 + -0xc <= anchor) {
      iStack_185e8 = (int)pcVar7 - (int)iend;
      if ((limit == noLimit) ||
         ((long)(oend + (ulong)(iStack_185e8 + 0xf0) / 0xff + ((long)iStack_185e8 - (long)dest) + 1)
          <= (long)(ulong)(uint)maxOutputSize)) {
        if (iStack_185e8 < 0xf) {
          *oend = (char)iStack_185e8 * '\x10';
          oend = oend + 1;
        }
        else {
          *oend = 0xf0;
          pBVar14 = oend;
          for (iStack_185e8 = iStack_185e8 + -0xf; oend = pBVar14 + 1, 0xfe < iStack_185e8;
              iStack_185e8 = iStack_185e8 + -0xff) {
            *oend = 0xff;
            pBVar14 = oend;
          }
          *oend = (BYTE)iStack_185e8;
          oend = pBVar14 + 2;
        }
        memcpy(oend,iend,(long)pcVar7 - (long)iend);
        ctx_local._4_4_ = (((int)pcVar7 - (int)iend) + (int)oend) - (int)dest;
      }
      else {
        ctx_local._4_4_ = 0;
      }
      return ctx_local._4_4_;
    }
    uVar9 = (long)anchor - (long)iend;
    match_num = 0;
    memset(aiStack_10508,0,0x10);
    _mnum = &ip;
    local_3e8 = anchor;
    local_3f8 = (U32 *)0x3;
    local_404 = fullUpdate;
    local_408 = 0;
    local_3f0 = puVar8;
    local_3e0 = ctx;
    if (anchor < ctx->base + ctx->nextToUpdate) {
      local_3d4 = 0;
    }
    else {
      if (fullUpdate != 0) {
        local_3b8 = anchor;
        _idx = ctx->base;
        local_3cc = (int)anchor - (int)_idx;
        base = puVar8;
        local_3b0 = ctx;
        for (local_3d0 = ctx->nextToUpdate; pLVar4 = local_3b0, local_3d0 < local_3cc;
            local_3d0 = local_3d0 + 1) {
          local_218 = _idx + local_3d0;
          local_210 = local_3b0;
          local_220 = base;
          local_228 = (U32 *)0x8;
          local_230 = 0;
          chainTable = (U16 *)0x0;
          HashTable = (U32 *)local_3b0->chainTable;
          base_1 = (BYTE *)local_3b0;
          _current = local_3b0->base;
          lowLimit = local_3b0->dictLimit;
          local_258 = (int)local_218 - (int)_current;
          if (local_258 < local_3b0->lowLimit + 0xffff) {
            uStack_185ec = local_3b0->lowLimit;
          }
          else {
            uStack_185ec = local_258 - 0xfffe;
          }
          dictBase._4_4_ = uStack_185ec;
          match = local_3b0->dictBase;
          ptr0._4_4_ = local_3b0->searchNum;
          ptr0._0_4_ = 0;
          HashPos = (U32 *)0x0;
          if (local_218 + 4 <= base) {
            UVar5 = LZ4HC_hashPtr(local_218);
            vLimit = (BYTE *)(pLVar4->hashTable + UVar5);
            matchLength._0_4_ = *(uint32_t *)vLimit;
            *(uint *)vLimit = local_258;
            ptr1 = (U16 *)((long)HashTable + (ulong)(local_258 * 2 + 1 & 0x1ffff) * 2);
            _matchIndex = (ushort *)((long)HashTable + (ulong)((local_258 & 0xffff) << 1) * 2);
            matchLength._4_2_ = (short)local_258 - (short)(uint32_t)matchLength;
            matchLength._6_2_ = matchLength._4_2_;
            while( true ) {
              bVar15 = false;
              if (((uint32_t)matchLength < local_258) &&
                 (bVar15 = false, dictBase._4_4_ <= (uint32_t)matchLength)) {
                bVar15 = ptr0._4_4_ != 0;
              }
              if (!bVar15) break;
              ptr0._4_4_ = ptr0._4_4_ - 1;
              if ((uint32_t)matchLength < lowLimit) {
                local_2a8 = local_218 + (lowLimit - (uint32_t)matchLength);
                _mnum_1 = match + (uint32_t)matchLength;
                if (local_220 < local_2a8) {
                  local_2a8 = local_220;
                }
                uVar6 = LZ4_count(local_218,_mnum_1,local_2a8);
                HashPos = (U32 *)(ulong)uVar6;
                if ((local_218 + (long)HashPos == local_2a8) && (local_2a8 < local_220)) {
                  uVar6 = LZ4_count(local_218 + (long)HashPos,_current + lowLimit,local_220);
                  HashPos = (U32 *)((ulong)uVar6 + (long)HashPos);
                }
              }
              else {
                _mnum_1 = _current + (uint32_t)matchLength;
                uVar6 = LZ4_count(local_218,_mnum_1,local_220);
                HashPos = (U32 *)(ulong)uVar6;
              }
              if (local_228 < HashPos) {
                local_228 = HashPos;
                if (local_230 != 0) {
                  if ((uint32_t)matchLength < lowLimit) {
                    *(uint32_t *)(local_230 + (long)(int)ptr0 * 8) =
                         (int)local_218 - ((int)_current + (uint32_t)matchLength);
                  }
                  else {
                    *(int *)(local_230 + (long)(int)ptr0 * 8) = (int)local_218 - (int)_mnum_1;
                  }
                  *(int *)(local_230 + 4 + (long)(int)ptr0 * 8) = (int)HashPos;
                  ptr0._0_4_ = (int)ptr0 + 1;
                }
                if ((U32 *)0x1000 < HashPos) break;
              }
              if (local_220 <= local_218 + (long)HashPos) break;
              if (local_218[(long)HashPos] < _mnum_1[(long)HashPos]) {
                *ptr1 = matchLength._6_2_;
                ptr1 = (U16 *)((long)HashTable + (ulong)(((uint32_t)matchLength & 0xffff) << 1) * 2)
                ;
                if (*ptr1 == 0xffff) break;
                matchLength._6_2_ = *ptr1;
                matchLength._4_2_ = matchLength._4_2_ + matchLength._6_2_;
                uVar1 = matchLength._6_2_;
              }
              else {
                *_matchIndex = matchLength._4_2_;
                _matchIndex = (ushort *)
                              ((long)HashTable +
                              (ulong)((uint32_t)matchLength * 2 + 1 & 0x1ffff) * 2);
                if (*_matchIndex == 0xffff) break;
                matchLength._4_2_ = *_matchIndex;
                matchLength._6_2_ = matchLength._6_2_ + matchLength._4_2_;
                uVar1 = matchLength._4_2_;
              }
              matchLength._0_4_ = (uint32_t)matchLength - uVar1;
            }
            *ptr1 = 0xffff;
            *_matchIndex = 0xffff;
            if (chainTable != (U16 *)0x0) {
              *(int *)chainTable = (int)ptr0;
            }
          }
          local_204 = 1;
        }
      }
      pLVar4 = local_3e0;
      local_168 = local_3e0;
      local_170 = local_3e8;
      local_178 = local_3f0;
      local_180 = local_3f8;
      local_188 = _mnum;
      chainTable_1 = (U16 *)&local_408;
      HashTable_1 = (U32 *)local_3e0->chainTable;
      base_2 = (BYTE *)local_3e0;
      _current_1 = local_3e0->base;
      lowLimit_1 = local_3e0->dictLimit;
      local_1b0 = (int)local_3e8 - (int)_current_1;
      if (local_1b0 < local_3e0->lowLimit + 0xffff) {
        uStack_18600 = local_3e0->lowLimit;
      }
      else {
        uStack_18600 = local_1b0 - 0xfffe;
      }
      dictBase_1._4_4_ = uStack_18600;
      match_1 = local_3e0->dictBase;
      ptr0_1._4_4_ = local_3e0->searchNum;
      ptr0_1._0_4_ = 0;
      HashPos_1 = (U32 *)0x0;
      if (local_3e8 + 4 <= local_3f0) {
        UVar5 = LZ4HC_hashPtr(local_3e8);
        vLimit_1 = (BYTE *)(pLVar4->hashTable + UVar5);
        matchLength_1._0_4_ = *(uint32_t *)vLimit_1;
        *(uint *)vLimit_1 = local_1b0;
        ptr1_1 = (U16 *)((long)HashTable_1 + (ulong)(local_1b0 * 2 + 1 & 0x1ffff) * 2);
        _matchIndex_1 = (ushort *)((long)HashTable_1 + (ulong)((local_1b0 & 0xffff) << 1) * 2);
        matchLength_1._4_2_ = (short)local_1b0 - (short)(uint32_t)matchLength_1;
        matchLength_1._6_2_ = matchLength_1._4_2_;
        while( true ) {
          bVar15 = false;
          if (((uint32_t)matchLength_1 < local_1b0) &&
             (bVar15 = false, dictBase_1._4_4_ <= (uint32_t)matchLength_1)) {
            bVar15 = ptr0_1._4_4_ != 0;
          }
          if (!bVar15) break;
          ptr0_1._4_4_ = ptr0_1._4_4_ - 1;
          if ((uint32_t)matchLength_1 < lowLimit_1) {
            local_200 = local_170 + (lowLimit_1 - (uint32_t)matchLength_1);
            _mnum_2 = match_1 + (uint32_t)matchLength_1;
            if (local_178 < local_200) {
              local_200 = local_178;
            }
            uVar6 = LZ4_count(local_170,_mnum_2,local_200);
            HashPos_1 = (U32 *)(ulong)uVar6;
            if ((local_170 + (long)HashPos_1 == local_200) && (local_200 < local_178)) {
              uVar6 = LZ4_count(local_170 + (long)HashPos_1,_current_1 + lowLimit_1,local_178);
              HashPos_1 = (U32 *)((ulong)uVar6 + (long)HashPos_1);
            }
          }
          else {
            _mnum_2 = _current_1 + (uint32_t)matchLength_1;
            uVar6 = LZ4_count(local_170,_mnum_2,local_178);
            HashPos_1 = (U32 *)(ulong)uVar6;
          }
          if (local_180 < HashPos_1) {
            local_180 = HashPos_1;
            if (local_188 != (BYTE **)0x0) {
              if ((uint32_t)matchLength_1 < lowLimit_1) {
                *(uint32_t *)(local_188 + (int)ptr0_1) =
                     (int)local_170 - ((int)_current_1 + (uint32_t)matchLength_1);
              }
              else {
                *(int *)(local_188 + (int)ptr0_1) = (int)local_170 - (int)_mnum_2;
              }
              *(int *)((long)local_188 + (long)(int)ptr0_1 * 8 + 4) = (int)HashPos_1;
              ptr0_1._0_4_ = (int)ptr0_1 + 1;
            }
            if ((U32 *)0x1000 < HashPos_1) break;
          }
          if (local_178 <= local_170 + (long)HashPos_1) break;
          if (local_170[(long)HashPos_1] < _mnum_2[(long)HashPos_1]) {
            *ptr1_1 = matchLength_1._6_2_;
            ptr1_1 = (U16 *)((long)HashTable_1 +
                            (ulong)(((uint32_t)matchLength_1 & 0xffff) << 1) * 2);
            if (*ptr1_1 == 0xffff) break;
            matchLength_1._6_2_ = *ptr1_1;
            matchLength_1._4_2_ = matchLength_1._4_2_ + matchLength_1._6_2_;
            uVar1 = matchLength_1._6_2_;
          }
          else {
            *_matchIndex_1 = matchLength_1._4_2_;
            _matchIndex_1 =
                 (ushort *)
                 ((long)HashTable_1 + (ulong)((uint32_t)matchLength_1 * 2 + 1 & 0x1ffff) * 2);
            if (*_matchIndex_1 == 0xffff) break;
            matchLength_1._4_2_ = *_matchIndex_1;
            matchLength_1._6_2_ = matchLength_1._6_2_ + matchLength_1._4_2_;
            uVar1 = matchLength_1._4_2_;
          }
          matchLength_1._0_4_ = (uint32_t)matchLength_1 - uVar1;
        }
        *ptr1_1 = 0xffff;
        *_matchIndex_1 = 0xffff;
        if (chainTable_1 != (U16 *)0x0) {
          *(int *)chainTable_1 = (int)ptr0_1;
        }
      }
      local_15c = 1;
      local_3f8 = (U32 *)0x1;
      local_3e0->nextToUpdate = ((int)local_3e8 - (int)local_3e0->base) + 1;
      local_3d4 = local_408;
    }
    uVar10 = (ulong)local_3d4;
    local_408 = local_3d4;
    if (uVar10 == 0) {
      anchor = anchor + 1;
      goto LAB_0016b52e;
    }
    if (sufficient_len < (ulong)(long)matches[uVar10 - 2].len) {
      best_off = (size_t)matches[uVar10 - 2].len;
      matchNb = (size_t)matches[uVar10 - 2].off;
      best_mlen = 0;
      match_num = 1;
LAB_0016dd46:
      while( true ) {
        uVar9 = (ulong)opt[best_mlen].price;
        iVar2 = opt[best_mlen - 1].litlen;
        opt[best_mlen].price = (int)best_off;
        opt[best_mlen - 1].litlen = (int)matchNb;
        matchNb = (size_t)iVar2;
        if (best_mlen < uVar9) break;
        best_mlen = best_mlen - uVar9;
        best_off = uVar9;
      }
      best_mlen = 0;
      while (pBVar14 = oend, best_mlen < match_num) {
        iVar2 = opt[best_mlen].price;
        iVar3 = opt[best_mlen - 1].litlen;
        if (iVar2 == 1) {
          anchor = anchor + 1;
          best_mlen = best_mlen + 1;
        }
        else {
          best_mlen = (long)iVar2 + best_mlen;
          uVar9 = (long)anchor - (long)iend;
          pBVar13 = oend + 1;
          if ((limit == noLimit) || (pBVar13 + uVar9 + (uVar9 >> 8) + 8 <= dest + maxOutputSize)) {
            if (uVar9 < 0xf) {
              *oend = (char)uVar9 * '\x10';
              oend = pBVar13;
            }
            else {
              *oend = 0xf0;
              oend = pBVar13;
              for (local_4c0 = uVar9 - 0xf; 0xfe < local_4c0; local_4c0 = local_4c0 - 0xff) {
                *oend = 0xff;
                oend = oend + 1;
              }
              *oend = (BYTE)local_4c0;
              oend = oend + 1;
            }
            LZ4_wildCopy(oend,iend,oend + uVar9);
            LZ4_writeLE16(oend + uVar9,(U16)iVar3);
            oend = oend + uVar9 + 2;
            uVar9 = (ulong)(iVar2 + -4);
            if ((limit == noLimit) || (oend + (uVar9 >> 8) + 6 <= dest + maxOutputSize)) {
              if (uVar9 < 0xf) {
                *pBVar14 = *pBVar14 + (char)(iVar2 + -4);
              }
              else {
                *pBVar14 = *pBVar14 + '\x0f';
                for (token = (BYTE *)(uVar9 - 0xf); (BYTE *)0x1fd < token; token = token + -0x1fe) {
                  pBVar14 = oend + 1;
                  *oend = 0xff;
                  oend = oend + 2;
                  *pBVar14 = 0xff;
                }
                if ((BYTE *)0xfe < token) {
                  token = token + -0xff;
                  *oend = 0xff;
                  oend = oend + 1;
                }
                *oend = (BYTE)token;
                oend = oend + 1;
              }
              iend = anchor + iVar2;
              bVar15 = false;
              anchor = iend;
            }
            else {
              bVar15 = true;
            }
          }
          else {
            bVar15 = true;
            oend = pBVar13;
          }
          if (bVar15) {
            return 0;
          }
        }
      }
    }
    else {
      for (mlen = 0; mlen < uVar10; mlen = mlen + 1) {
        if (mlen == 0) {
          sStack_18618 = 4;
        }
        else {
          sStack_18618 = (long)matches[mlen - 2].len + 1;
        }
        cost = sStack_18618;
        iVar2 = matches[mlen - 1].len;
        for (; cost <= (ulong)(long)iVar2; cost = cost + 1) {
          price = cost;
          local_348 = uVar9;
          if (0xe < uVar9) {
            local_348 = (uVar9 - 0xf) / 0xff + 1 + uVar9;
          }
          local_360 = local_348 + 3;
          if (0x12 < cost) {
            local_360 = (cost - 0x13) / 0xff + 1 + local_360;
          }
          local_2b8 = uVar9;
          if (0xe < uVar9) {
            local_2b8 = (uVar9 - 0xf) / 0xff + 1 + uVar9;
          }
          for (; match_num < cost; match_num = match_num + 1) {
            aiStack_10508[(match_num + 1) * 4] = 0x40000000;
          }
          opt[cost].price = (int)cost;
          opt[cost - 1].litlen = matches[mlen - 1].off;
          opt[cost].off = 0;
          aiStack_10508[cost * 4] = (int)local_360 - (int)local_2b8;
          local_350 = uVar9;
          price_1 = uVar9;
          price_2 = uVar9;
        }
      }
      if (3 < match_num) {
        for (best_mlen = 1; best_mlen <= match_num; best_mlen = best_mlen + 1) {
          puVar11 = anchor + best_mlen;
          if (opt[best_mlen - 1].price == 1) {
            matchNb_1._0_4_ = opt[best_mlen - 1].off + 1;
            uVar10 = (ulong)(int)matchNb_1;
            if (uVar10 < best_mlen) {
              local_2c8 = uVar10;
              if (0xe < uVar10) {
                local_2c8 = (uVar10 - 0xf) / 0xff + 1 + uVar10;
              }
              litlen = (long)aiStack_10508[(best_mlen - uVar10) * 4] + local_2c8;
              price_4 = uVar10;
            }
            else {
              price_5 = uVar9 + uVar10;
              local_2d8 = price_5;
              if (0xe < price_5) {
                local_2d8 = (price_5 - 0xf) / 0xff + 1 + price_5;
              }
              local_2e8 = uVar9;
              if (0xe < uVar9) {
                local_2e8 = (uVar9 - 0xf) / 0xff + 1 + uVar9;
              }
              litlen = local_2d8 - local_2e8;
              price_6 = uVar9;
            }
          }
          else {
            matchNb_1._0_4_ = 1;
            price_7 = 1;
            local_2f8 = 1;
            litlen = (long)aiStack_10508[(best_mlen - 1) * 4] + 1;
          }
          if (litlen < (ulong)(long)aiStack_10508[best_mlen * 4]) {
            for (; match_num < best_mlen; match_num = match_num + 1) {
              aiStack_10508[(match_num + 1) * 4] = 0x40000000;
            }
            opt[best_mlen].price = 1;
            opt[best_mlen - 1].litlen = 0;
            opt[best_mlen].off = (int)matchNb_1;
            aiStack_10508[best_mlen * 4] = (int)litlen;
          }
          if ((best_mlen == match_num) || (pcVar7 + -0xc <= puVar11)) break;
          _mnum_3 = &ip;
          local_458 = (U32 *)0x3;
          local_464 = fullUpdate;
          local_468 = 0;
          local_450 = puVar8;
          local_448 = puVar11;
          local_440 = ctx;
          if (puVar11 < ctx->base + ctx->nextToUpdate) {
            local_434 = 0;
          }
          else {
            if (fullUpdate != 0) {
              _idx_1 = ctx->base;
              local_42c = (int)puVar11 - (int)_idx_1;
              base_3 = puVar8;
              local_418 = puVar11;
              local_410 = ctx;
              for (local_430 = ctx->nextToUpdate; pLVar4 = local_410, local_430 < local_42c;
                  local_430 = local_430 + 1) {
                local_c8 = _idx_1 + local_430;
                local_c0 = local_410;
                local_d0 = base_3;
                local_d8 = (U32 *)0x8;
                local_e0 = 0;
                chainTable_2 = (U16 *)0x0;
                HashTable_2 = (U32 *)local_410->chainTable;
                base_4 = (BYTE *)local_410;
                _current_2 = local_410->base;
                lowLimit_2 = local_410->dictLimit;
                local_108 = (int)local_c8 - (int)_current_2;
                if (local_108 < local_410->lowLimit + 0xffff) {
                  uStack_1863c = local_410->lowLimit;
                }
                else {
                  uStack_1863c = local_108 - 0xfffe;
                }
                dictBase_2._4_4_ = uStack_1863c;
                match_2 = local_410->dictBase;
                ptr0_2._4_4_ = local_410->searchNum;
                ptr0_2._0_4_ = 0;
                HashPos_2 = (U32 *)0x0;
                if (local_c8 + 4 <= base_3) {
                  UVar5 = LZ4HC_hashPtr(local_c8);
                  vLimit_2 = (BYTE *)(pLVar4->hashTable + UVar5);
                  matchLength_2._0_4_ = *(uint32_t *)vLimit_2;
                  *(uint *)vLimit_2 = local_108;
                  ptr1_2 = (U16 *)((long)HashTable_2 + (ulong)(local_108 * 2 + 1 & 0x1ffff) * 2);
                  _matchIndex_2 =
                       (ushort *)((long)HashTable_2 + (ulong)((local_108 & 0xffff) << 1) * 2);
                  matchLength_2._4_2_ = (short)local_108 - (short)(uint32_t)matchLength_2;
                  matchLength_2._6_2_ = matchLength_2._4_2_;
                  while( true ) {
                    bVar15 = false;
                    if (((uint32_t)matchLength_2 < local_108) &&
                       (bVar15 = false, dictBase_2._4_4_ <= (uint32_t)matchLength_2)) {
                      bVar15 = ptr0_2._4_4_ != 0;
                    }
                    if (!bVar15) break;
                    ptr0_2._4_4_ = ptr0_2._4_4_ - 1;
                    if ((uint32_t)matchLength_2 < lowLimit_2) {
                      local_158 = local_c8 + (lowLimit_2 - (uint32_t)matchLength_2);
                      _mnum_4 = match_2 + (uint32_t)matchLength_2;
                      if (local_d0 < local_158) {
                        local_158 = local_d0;
                      }
                      uVar6 = LZ4_count(local_c8,_mnum_4,local_158);
                      HashPos_2 = (U32 *)(ulong)uVar6;
                      if ((local_c8 + (long)HashPos_2 == local_158) && (local_158 < local_d0)) {
                        uVar6 = LZ4_count(local_c8 + (long)HashPos_2,_current_2 + lowLimit_2,
                                          local_d0);
                        HashPos_2 = (U32 *)((ulong)uVar6 + (long)HashPos_2);
                      }
                    }
                    else {
                      _mnum_4 = _current_2 + (uint32_t)matchLength_2;
                      uVar6 = LZ4_count(local_c8,_mnum_4,local_d0);
                      HashPos_2 = (U32 *)(ulong)uVar6;
                    }
                    if (local_d8 < HashPos_2) {
                      local_d8 = HashPos_2;
                      if (local_e0 != 0) {
                        if ((uint32_t)matchLength_2 < lowLimit_2) {
                          *(uint32_t *)(local_e0 + (long)(int)ptr0_2 * 8) =
                               (int)local_c8 - ((int)_current_2 + (uint32_t)matchLength_2);
                        }
                        else {
                          *(int *)(local_e0 + (long)(int)ptr0_2 * 8) = (int)local_c8 - (int)_mnum_4;
                        }
                        *(int *)(local_e0 + 4 + (long)(int)ptr0_2 * 8) = (int)HashPos_2;
                        ptr0_2._0_4_ = (int)ptr0_2 + 1;
                      }
                      if ((U32 *)0x1000 < HashPos_2) break;
                    }
                    if (local_d0 <= local_c8 + (long)HashPos_2) break;
                    if (local_c8[(long)HashPos_2] < _mnum_4[(long)HashPos_2]) {
                      *ptr1_2 = matchLength_2._6_2_;
                      ptr1_2 = (U16 *)((long)HashTable_2 +
                                      (ulong)(((uint32_t)matchLength_2 & 0xffff) << 1) * 2);
                      if (*ptr1_2 == 0xffff) break;
                      matchLength_2._6_2_ = *ptr1_2;
                      matchLength_2._4_2_ = matchLength_2._4_2_ + matchLength_2._6_2_;
                      uVar1 = matchLength_2._6_2_;
                    }
                    else {
                      *_matchIndex_2 = matchLength_2._4_2_;
                      _matchIndex_2 =
                           (ushort *)
                           ((long)HashTable_2 +
                           (ulong)((uint32_t)matchLength_2 * 2 + 1 & 0x1ffff) * 2);
                      if (*_matchIndex_2 == 0xffff) break;
                      matchLength_2._4_2_ = *_matchIndex_2;
                      matchLength_2._6_2_ = matchLength_2._6_2_ + matchLength_2._4_2_;
                      uVar1 = matchLength_2._4_2_;
                    }
                    matchLength_2._0_4_ = (uint32_t)matchLength_2 - uVar1;
                  }
                  *ptr1_2 = 0xffff;
                  *_matchIndex_2 = 0xffff;
                  if (chainTable_2 != (U16 *)0x0) {
                    *(int *)chainTable_2 = (int)ptr0_2;
                  }
                }
                local_b4 = 1;
              }
            }
            pLVar4 = local_440;
            local_18 = local_440;
            local_20 = local_448;
            local_28 = local_450;
            local_30 = local_458;
            local_38 = _mnum_3;
            chainTable_3 = (U16 *)&local_468;
            HashTable_3 = (U32 *)local_440->chainTable;
            base_5 = (BYTE *)local_440;
            _current_3 = local_440->base;
            lowLimit_3 = local_440->dictLimit;
            local_60 = (int)local_448 - (int)_current_3;
            if (local_60 < local_440->lowLimit + 0xffff) {
              uStack_18650 = local_440->lowLimit;
            }
            else {
              uStack_18650 = local_60 - 0xfffe;
            }
            dictBase_3._4_4_ = uStack_18650;
            match_3 = local_440->dictBase;
            ptr0_3._4_4_ = local_440->searchNum;
            ptr0_3._0_4_ = 0;
            HashPos_3 = (U32 *)0x0;
            if (local_448 + 4 <= local_450) {
              UVar5 = LZ4HC_hashPtr(local_448);
              vLimit_3 = (BYTE *)(pLVar4->hashTable + UVar5);
              matchLength_3._0_4_ = *(uint32_t *)vLimit_3;
              *(uint *)vLimit_3 = local_60;
              ptr1_3 = (U16 *)((long)HashTable_3 + (ulong)(local_60 * 2 + 1 & 0x1ffff) * 2);
              _matchIndex_3 = (ushort *)((long)HashTable_3 + (ulong)((local_60 & 0xffff) << 1) * 2);
              matchLength_3._4_2_ = (short)local_60 - (short)(uint32_t)matchLength_3;
              matchLength_3._6_2_ = matchLength_3._4_2_;
              while( true ) {
                bVar15 = false;
                if (((uint32_t)matchLength_3 < local_60) &&
                   (bVar15 = false, dictBase_3._4_4_ <= (uint32_t)matchLength_3)) {
                  bVar15 = ptr0_3._4_4_ != 0;
                }
                if (!bVar15) break;
                ptr0_3._4_4_ = ptr0_3._4_4_ - 1;
                if ((uint32_t)matchLength_3 < lowLimit_3) {
                  local_b0 = local_20 + (lowLimit_3 - (uint32_t)matchLength_3);
                  _mnum_5 = match_3 + (uint32_t)matchLength_3;
                  if (local_28 < local_b0) {
                    local_b0 = local_28;
                  }
                  uVar6 = LZ4_count(local_20,_mnum_5,local_b0);
                  HashPos_3 = (U32 *)(ulong)uVar6;
                  if ((local_20 + (long)HashPos_3 == local_b0) && (local_b0 < local_28)) {
                    uVar6 = LZ4_count(local_20 + (long)HashPos_3,_current_3 + lowLimit_3,local_28);
                    HashPos_3 = (U32 *)((ulong)uVar6 + (long)HashPos_3);
                  }
                }
                else {
                  _mnum_5 = _current_3 + (uint32_t)matchLength_3;
                  uVar6 = LZ4_count(local_20,_mnum_5,local_28);
                  HashPos_3 = (U32 *)(ulong)uVar6;
                }
                if (local_30 < HashPos_3) {
                  local_30 = HashPos_3;
                  if (local_38 != (BYTE **)0x0) {
                    if ((uint32_t)matchLength_3 < lowLimit_3) {
                      *(uint32_t *)(local_38 + (int)ptr0_3) =
                           (int)local_20 - ((int)_current_3 + (uint32_t)matchLength_3);
                    }
                    else {
                      *(int *)(local_38 + (int)ptr0_3) = (int)local_20 - (int)_mnum_5;
                    }
                    *(int *)((long)local_38 + (long)(int)ptr0_3 * 8 + 4) = (int)HashPos_3;
                    ptr0_3._0_4_ = (int)ptr0_3 + 1;
                  }
                  if ((U32 *)0x1000 < HashPos_3) break;
                }
                if (local_28 <= local_20 + (long)HashPos_3) break;
                if (local_20[(long)HashPos_3] < _mnum_5[(long)HashPos_3]) {
                  *ptr1_3 = matchLength_3._6_2_;
                  ptr1_3 = (U16 *)((long)HashTable_3 +
                                  (ulong)(((uint32_t)matchLength_3 & 0xffff) << 1) * 2);
                  if (*ptr1_3 == 0xffff) break;
                  matchLength_3._6_2_ = *ptr1_3;
                  matchLength_3._4_2_ = matchLength_3._4_2_ + matchLength_3._6_2_;
                  uVar1 = matchLength_3._6_2_;
                }
                else {
                  *_matchIndex_3 = matchLength_3._4_2_;
                  _matchIndex_3 =
                       (ushort *)
                       ((long)HashTable_3 + (ulong)((uint32_t)matchLength_3 * 2 + 1 & 0x1ffff) * 2);
                  if (*_matchIndex_3 == 0xffff) break;
                  matchLength_3._4_2_ = *_matchIndex_3;
                  matchLength_3._6_2_ = matchLength_3._6_2_ + matchLength_3._4_2_;
                  uVar1 = matchLength_3._4_2_;
                }
                matchLength_3._0_4_ = (uint32_t)matchLength_3 - uVar1;
              }
              *ptr1_3 = 0xffff;
              *_matchIndex_3 = 0xffff;
              if (chainTable_3 != (U16 *)0x0) {
                *(int *)chainTable_3 = (int)ptr0_3;
              }
            }
            local_c = 1;
            local_458 = (U32 *)0x1;
            local_440->nextToUpdate = ((int)local_448 - (int)local_440->base) + 1;
            local_434 = local_468;
          }
          uVar10 = (ulong)local_434;
          local_468 = local_434;
          if ((uVar10 != 0) && (sufficient_len < (ulong)(long)matches[uVar10 - 2].len)) {
            best_off = (size_t)matches[uVar10 - 2].len;
            matchNb = (size_t)matches[uVar10 - 2].off;
            match_num = best_mlen + 1;
            goto LAB_0016dd46;
          }
          for (ml = 0; ml < uVar10; ml = ml + 1) {
            if (ml == 0) {
              sStack_18668 = 4;
            }
            else {
              sStack_18668 = (long)matches[ml - 2].len + 1;
            }
            ll = sStack_18668;
            if (best_mlen + (long)matches[ml - 1].len < 0x1000) {
              uStack_18670 = (ulong)matches[ml - 1].len;
            }
            else {
              uStack_18670 = 0x1000 - best_mlen;
            }
            for (; ll <= uStack_18670; ll = ll + 1) {
              if (opt[best_mlen].price == 1) {
                price_8._0_4_ = opt[best_mlen].off;
                uVar12 = (ulong)(int)price_8;
                if (uVar12 < best_mlen) {
                  price_9 = ll;
                  local_338 = uVar12;
                  if (0xe < uVar12) {
                    local_338 = (uVar12 - 0xf) / 0xff + 1 + uVar12;
                  }
                  local_378 = local_338 + 3;
                  if (0x12 < ll) {
                    local_378 = (ll - 0x13) / 0xff + 1 + local_378;
                  }
                  ml_1 = aiStack_10508[(best_mlen - uVar12) * 4] + local_378;
                  local_368 = uVar12;
                  price_10 = uVar12;
                }
                else {
                  local_380 = uVar9 + uVar12;
                  price_11 = ll;
                  local_328 = local_380;
                  if (0xe < local_380) {
                    local_328 = (local_380 - 0xf) / 0xff + 1 + local_380;
                  }
                  local_390 = local_328 + 3;
                  if (0x12 < ll) {
                    local_390 = (ll - 0x13) / 0xff + 1 + local_390;
                  }
                  local_308 = uVar9;
                  if (0xe < uVar9) {
                    local_308 = (uVar9 - 0xf) / 0xff + 1 + uVar9;
                  }
                  ml_1 = local_390 - local_308;
                  price_12 = local_380;
                  price_13 = uVar9;
                }
              }
              else {
                price_8._0_4_ = 0;
                local_398 = 0;
                price_14 = ll;
                price_15 = 0;
                local_318 = 0;
                local_3a8 = 3;
                if (0x12 < ll) {
                  local_3a8 = (ll - 0x13) / 0xff + 4;
                }
                ml_1 = aiStack_10508[best_mlen * 4] + local_3a8;
              }
              if ((match_num < best_mlen + ll) ||
                 (ml_1 < (ulong)(long)aiStack_10508[(best_mlen + ll) * 4])) {
                for (; match_num < best_mlen + ll; match_num = match_num + 1) {
                  aiStack_10508[(match_num + 1) * 4] = 0x40000000;
                }
                opt[best_mlen + ll].price = (int)ll;
                opt[best_mlen + ll + -1].litlen = matches[ml - 1].off;
                opt[best_mlen + ll].off = (int)price_8;
                aiStack_10508[(best_mlen + ll) * 4] = (int)ml_1;
              }
            }
          }
        }
        best_off = (size_t)opt[match_num].price;
        matchNb = (size_t)opt[match_num - 1].litlen;
        best_mlen = match_num - best_off;
        goto LAB_0016dd46;
      }
      anchor = anchor + 1;
    }
  } while( true );
}

Assistant:

static int LZ4HC_compress_optimal (
    LZ4HC_CCtx_internal* ctx,
    const char* const source,
    char* dest,
    int inputSize,
    int maxOutputSize,
    limitedOutput_directive limit,
    size_t sufficient_len,
    const int fullUpdate
    )
{
    LZ4HC_optimal_t opt[LZ4_OPT_NUM + 1];   /* this uses a bit too much stack memory to my taste ... */
    LZ4HC_match_t matches[LZ4_OPT_NUM + 1];

    const BYTE* ip = (const BYTE*) source;
    const BYTE* anchor = ip;
    const BYTE* const iend = ip + inputSize;
    const BYTE* const mflimit = iend - MFLIMIT;
    const BYTE* const matchlimit = (iend - LASTLITERALS);
    BYTE* op = (BYTE*) dest;
    BYTE* const oend = op + maxOutputSize;

    /* init */
    if (sufficient_len >= LZ4_OPT_NUM) sufficient_len = LZ4_OPT_NUM-1;
    ctx->end += inputSize;
    ip++;

    /* Main Loop */
    while (ip < mflimit) {
        size_t const llen = ip - anchor;
        size_t last_pos = 0;
        size_t match_num, cur, best_mlen, best_off;
        memset(opt, 0, sizeof(LZ4HC_optimal_t));

        match_num = LZ4HC_BinTree_GetAllMatches(ctx, ip, matchlimit, MINMATCH-1, matches, fullUpdate);
        if (!match_num) { ip++; continue; }

        if ((size_t)matches[match_num-1].len > sufficient_len) {
            /* good enough solution : immediate encoding */
            best_mlen = matches[match_num-1].len;
            best_off = matches[match_num-1].off;
            cur = 0;
            last_pos = 1;
            goto encode;
        }

        /* set prices using matches at position = 0 */
        {   size_t matchNb;
            for (matchNb = 0; matchNb < match_num; matchNb++) {
                size_t mlen = (matchNb>0) ? (size_t)matches[matchNb-1].len+1 : MINMATCH;
                best_mlen = matches[matchNb].len;   /* necessarily < sufficient_len < LZ4_OPT_NUM */
                for ( ; mlen <= best_mlen ; mlen++) {
                    size_t const cost = LZ4HC_sequencePrice(llen, mlen) - LZ4HC_literalsPrice(llen);
                    SET_PRICE(mlen, mlen, matches[matchNb].off, 0, cost);   /* updates last_pos and opt[pos] */
        }   }   }

        if (last_pos < MINMATCH) { ip++; continue; }  /* note : on clang at least, this test improves performance */

        /* check further positions */
        opt[0].mlen = opt[1].mlen = 1;
        for (cur = 1; cur <= last_pos; cur++) {
            const BYTE* const curPtr = ip + cur;

            /* establish baseline price if cur is literal */
            {   size_t price, litlen;
                if (opt[cur-1].mlen == 1) {
                    /* no match at previous position */
                    litlen = opt[cur-1].litlen + 1;
                    if (cur > litlen) {
                        price = opt[cur - litlen].price + LZ4HC_literalsPrice(litlen);
                    } else {
                        price = LZ4HC_literalsPrice(llen + litlen) - LZ4HC_literalsPrice(llen);
                    }
                } else {
                    litlen = 1;
                    price = opt[cur - 1].price + LZ4HC_literalsPrice(1);
                }

                if (price < (size_t)opt[cur].price)
                    SET_PRICE(cur, 1, 0, litlen, price);   /* note : increases last_pos */
            }

            if (cur == last_pos || curPtr >= mflimit) break;

            match_num = LZ4HC_BinTree_GetAllMatches(ctx, curPtr, matchlimit, MINMATCH-1, matches, fullUpdate);
            if ((match_num > 0) && (size_t)matches[match_num-1].len > sufficient_len) {
                /* immediate encoding */
                best_mlen = matches[match_num-1].len;
                best_off = matches[match_num-1].off;
                last_pos = cur + 1;
                goto encode;
            }

            /* set prices using matches at position = cur */
            {   size_t matchNb;
                for (matchNb = 0; matchNb < match_num; matchNb++) {
                    size_t ml = (matchNb>0) ? (size_t)matches[matchNb-1].len+1 : MINMATCH;
                    best_mlen = (cur + matches[matchNb].len < LZ4_OPT_NUM) ?
                                (size_t)matches[matchNb].len : LZ4_OPT_NUM - cur;

                    for ( ; ml <= best_mlen ; ml++) {
                        size_t ll, price;
                        if (opt[cur].mlen == 1) {
                            ll = opt[cur].litlen;
                            if (cur > ll)
                                price = opt[cur - ll].price + LZ4HC_sequencePrice(ll, ml);
                            else
                                price = LZ4HC_sequencePrice(llen + ll, ml) - LZ4HC_literalsPrice(llen);
                        } else {
                            ll = 0;
                            price = opt[cur].price + LZ4HC_sequencePrice(0, ml);
                        }

                        if (cur + ml > last_pos || price < (size_t)opt[cur + ml].price) {
                            SET_PRICE(cur + ml, ml, matches[matchNb].off, ll, price);
            }   }   }   }
        } /* for (cur = 1; cur <= last_pos; cur++) */

        best_mlen = opt[last_pos].mlen;
        best_off = opt[last_pos].off;
        cur = last_pos - best_mlen;

encode: /* cur, last_pos, best_mlen, best_off must be set */
        opt[0].mlen = 1;
        while (1) {  /* from end to beginning */
            size_t const ml = opt[cur].mlen;
            int const offset = opt[cur].off;
            opt[cur].mlen = (int)best_mlen;
            opt[cur].off = (int)best_off;
            best_mlen = ml;
            best_off = offset;
            if (ml > cur) break;
            cur -= ml;
        }

        /* encode all recorded sequences */
        cur = 0;
        while (cur < last_pos) {
            int const ml = opt[cur].mlen;
            int const offset = opt[cur].off;
            if (ml == 1) { ip++; cur++; continue; }
            cur += ml;
            if ( LZ4HC_encodeSequence(&ip, &op, &anchor, ml, ip - offset, limit, oend) ) return 0;
        }
    }  /* while (ip < mflimit) */

    /* Encode Last Literals */
    {   int lastRun = (int)(iend - anchor);
        if ((limit) && (((char*)op - dest) + lastRun + 1 + ((lastRun+255-RUN_MASK)/255) > (U32)maxOutputSize)) return 0;  /* Check output limit */
        if (lastRun>=(int)RUN_MASK) { *op++=(RUN_MASK<<ML_BITS); lastRun-=RUN_MASK; for(; lastRun > 254 ; lastRun-=255) *op++ = 255; *op++ = (BYTE) lastRun; }
        else *op++ = (BYTE)(lastRun<<ML_BITS);
        memcpy(op, anchor, iend - anchor);
        op += iend-anchor;
    }

    /* End */
    return (int) ((char*)op-dest);
}